

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::java::FileGenerator::Validate(FileGenerator *this,string *error)

{
  string *psVar1;
  FileDescriptor *pFVar2;
  bool bVar3;
  Edition EVar4;
  LogMessage *pLVar5;
  long lVar6;
  AlphaNum *in_R9;
  long lVar7;
  string_view v;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view classname;
  string_view classname_00;
  string *local_118;
  AlphaNum local_110;
  string local_e0;
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  classname._M_str = (this->classname_)._M_dataplus._M_p;
  classname._M_len = (this->classname_)._M_string_length;
  local_118 = error;
  bVar3 = ClassNameResolver::HasConflictingClassName
                    (this->name_resolver_,this->file_,classname,EXACT_EQUAL);
  if (bVar3) {
    psVar1 = this->file_->name_;
    local_110.piece_._M_str = (psVar1->_M_dataplus)._M_p;
    local_110.piece_._M_len = psVar1->_M_string_length;
    local_60.piece_._M_len = 0x44;
    local_60.piece_._M_str =
         ": Cannot generate Java output because the file\'s outer class name, \"";
    local_90.piece_._M_str = (this->classname_)._M_dataplus._M_p;
    local_90.piece_._M_len = (this->classname_)._M_string_length;
    local_c0.piece_._M_len = 0xbe;
    local_c0.piece_._M_str =
         "\", matches the name of one of the types declared inside it.  Please either rename the type or use the java_outer_classname option to specify a different outer class name for the .proto file."
    ;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_e0,(lts_20250127 *)&local_110,&local_60,&local_90,&local_c0,in_R9);
    std::__cxx11::string::operator=((string *)local_118,(string *)&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    bVar3 = false;
  }
  else {
    classname_00._M_str = (this->classname_)._M_dataplus._M_p;
    classname_00._M_len = (this->classname_)._M_string_length;
    bVar3 = ClassNameResolver::HasConflictingClassName
                      (this->name_resolver_,this->file_,classname_00,EQUAL_IGNORE_CASE);
    if (bVar3) {
      absl::lts_20250127::log_internal::LogMessage::LogMessage
                ((LogMessage *)&local_110,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/file.cc"
                 ,0xe2);
      psVar1 = this->file_->name_;
      v._M_str = (psVar1->_M_dataplus)._M_p;
      v._M_len = psVar1->_M_string_length;
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<((LogMessage *)&local_110,v);
      str._M_str = ": The file\'s outer class name, \"";
      str._M_len = 0x20;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(pLVar5,str);
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,&this->classname_);
      str_00._M_str = "\", matches the name of one of the types declared inside it when ";
      str_00._M_len = 0x40;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (pLVar5,str_00);
      str_01._M_str = "case is ignored. This can cause compilation issues on Windows / ";
      str_01._M_len = 0x40;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (pLVar5,str_01);
      str_02._M_str = "MacOS. Please either rename the type or use the ";
      str_02._M_len = 0x30;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (pLVar5,str_02);
      str_03._M_str = "java_outer_classname option to specify a different outer class ";
      str_03._M_len = 0x3f;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (pLVar5,str_03);
      str_04._M_str = "name for the .proto file to be safe.";
      str_04._M_len = 0x24;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (pLVar5,str_04);
      absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)&local_110);
    }
    pFVar2 = this->file_;
    local_110.piece_._M_len = (size_t)&local_118;
    if (0 < pFVar2->message_type_count_) {
      lVar7 = 0;
      lVar6 = 0;
      local_110.piece_._M_len = (size_t)&local_118;
      do {
        protobuf::internal::
        VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/file.cc:238:56)>_>
        ::Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_java_file_cc:238:56)>_>
                   *)&local_110,(Descriptor *)(&pFVar2->message_types_->super_SymbolBase + lVar7));
        lVar6 = lVar6 + 1;
        lVar7 = lVar7 + 0xa0;
      } while (lVar6 < pFVar2->message_type_count_);
    }
    if (0 < pFVar2->extension_count_) {
      lVar7 = 0;
      lVar6 = 0;
      do {
        protobuf::internal::
        VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/file.cc:238:56)>_>
        ::Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_java_file_cc:238:56)>_>
                   *)&local_110,(FieldDescriptor *)(&pFVar2->extensions_->super_SymbolBase + lVar7))
        ;
        lVar6 = lVar6 + 1;
        lVar7 = lVar7 + 0x58;
      } while (lVar6 < pFVar2->extension_count_);
    }
    if (((this->file_->options_->field_0)._impl_.optimize_for_ == 3) &&
       ((this->options_).enforce_lite == false)) {
      absl::lts_20250127::log_internal::LogMessage::LogMessage
                ((LogMessage *)&local_110,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/file.cc"
                 ,0xf9);
      str_05._M_str = "The optimize_for = LITE_RUNTIME option is no longer supported by ";
      str_05._M_len = 0x41;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                ((LogMessage *)&local_110,str_05);
      str_06._M_str = "protobuf Java code generator and is ignored--protoc will always ";
      str_06._M_len = 0x40;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                ((LogMessage *)&local_110,str_06);
      str_07._M_str = "generate full runtime code for Java. To use Java Lite runtime, ";
      str_07._M_len = 0x3f;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                ((LogMessage *)&local_110,str_07);
      str_08._M_str = "users should use the Java Lite plugin instead. See:\n";
      str_08._M_len = 0x34;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                ((LogMessage *)&local_110,str_08);
      str_09._M_str = "  https://github.com/protocolbuffers/protobuf/blob/main/java/lite.md";
      str_09._M_len = 0x44;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                ((LogMessage *)&local_110,str_09);
      absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)&local_110);
    }
    pFVar2 = this->file_;
    local_110.piece_._M_len = (size_t)&local_118;
    if (0 < pFVar2->message_type_count_) {
      lVar7 = 0;
      lVar6 = 0;
      local_110.piece_._M_len = (size_t)&local_118;
      do {
        protobuf::internal::
        VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/file.cc:258:56)>_>
        ::Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_java_file_cc:258:56)>_>
                   *)&local_110,(Descriptor *)(&pFVar2->message_types_->super_SymbolBase + lVar7));
        lVar6 = lVar6 + 1;
        lVar7 = lVar7 + 0xa0;
      } while (lVar6 < pFVar2->message_type_count_);
    }
    if (0 < pFVar2->enum_type_count_) {
      lVar7 = 0;
      lVar6 = 0;
      do {
        protobuf::internal::
        VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/file.cc:258:56)>_>
        ::Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_java_file_cc:258:56)>_>
                   *)&local_110,(EnumDescriptor *)(&pFVar2->enum_types_->super_SymbolBase + lVar7));
        lVar6 = lVar6 + 1;
        lVar7 = lVar7 + 0x58;
      } while (lVar6 < pFVar2->enum_type_count_);
    }
    pFVar2 = this->file_;
    local_110.piece_._M_len = (size_t)&local_118;
    if (0 < pFVar2->message_type_count_) {
      lVar7 = 0;
      lVar6 = 0;
      local_110.piece_._M_len = (size_t)&local_118;
      do {
        protobuf::internal::
        VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/file.cc:272:56)>_>
        ::Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_java_file_cc:272:56)>_>
                   *)&local_110,(Descriptor *)(&pFVar2->message_types_->super_SymbolBase + lVar7));
        lVar6 = lVar6 + 1;
        lVar7 = lVar7 + 0xa0;
      } while (lVar6 < pFVar2->message_type_count_);
    }
    EVar4 = FileDescriptor::edition(this->file_);
    if ((1000 < (int)EVar4) && ((*(byte *)((long)&this->file_->options_->field_0 + 0x19) & 8) != 0))
    {
      local_110.piece_._M_len = 0xc1;
      local_110.piece_._M_str =
           "The file option `java_multiple_files` is not supported in editions 2024 and above, which defaults to the feature value of `nest_in_file_class = NO` (equivalent to `java_multiple_files = true`)."
      ;
      absl::lts_20250127::StrAppend(local_118,&local_110);
    }
    bVar3 = local_118->_M_string_length == 0;
  }
  return bVar3;
}

Assistant:

bool FileGenerator::Validate(std::string* error) {
  // Check that no class name matches the file's class name.  This is a common
  // problem that leads to Java compile errors that can be hard to understand.
  // It's especially bad when using the java_multiple_files, since we would
  // end up overwriting the outer class with one of the inner ones.
  if (name_resolver_->HasConflictingClassName(file_, classname_,
                                              NameEquality::EXACT_EQUAL)) {
    *error = absl::StrCat(
        file_->name(),
        ": Cannot generate Java output because the file's outer class name, "
        "\"",
        classname_,
        "\", matches the name of one of the types declared inside it.  "
        "Please either rename the type or use the java_outer_classname "
        "option to specify a different outer class name for the .proto file.");
    return false;
  }
  // Similar to the check above, but ignore the case this time. This is not a
  // problem on Linux, but will lead to Java compile errors on Windows / Mac
  // because filenames are case-insensitive on those platforms.
  if (name_resolver_->HasConflictingClassName(
          file_, classname_, NameEquality::EQUAL_IGNORE_CASE)) {
    ABSL_LOG(WARNING)
        << file_->name() << ": The file's outer class name, \"" << classname_
        << "\", matches the name of one of the types declared inside it when "
        << "case is ignored. This can cause compilation issues on Windows / "
        << "MacOS. Please either rename the type or use the "
        << "java_outer_classname option to specify a different outer class "
        << "name for the .proto file to be safe.";
  }

  // Check that no field is a closed enum with implicit presence. For normal
  // cases this will be rejected by protoc before the generator is invoked, but
  // for cases like legacy_closed_enum it may reach the generator.
  google::protobuf::internal::VisitDescriptors(*file_, [&](const FieldDescriptor& field) {
    if (field.enum_type() != nullptr && !SupportUnknownEnumValue(&field) &&
        !field.has_presence() && !field.is_repeated()) {
      absl::StrAppend(error, "Field ", field.full_name(),
                      " has a closed enum type with implicit presence.\n");
    }
  });

  // Print a warning if optimize_for = LITE_RUNTIME is used.
  if (file_->options().optimize_for() == FileOptions::LITE_RUNTIME &&
      !options_.enforce_lite) {
    ABSL_LOG(WARNING)
        << "The optimize_for = LITE_RUNTIME option is no longer supported by "
        << "protobuf Java code generator and is ignored--protoc will always "
        << "generate full runtime code for Java. To use Java Lite runtime, "
        << "users should use the Java Lite plugin instead. See:\n"
        << "  "
           "https://github.com/protocolbuffers/protobuf/blob/main/java/"
           "lite.md";
  }
  google::protobuf::internal::VisitDescriptors(*file_, [&](const EnumDescriptor& enm) {
    if (CheckLargeEnum(&enm) && enm.is_closed()) {
      absl::StrAppend(
          error, enm.full_name(),
          " is a closed enum and can not be used with the large_enum feature.  "
          "Please migrate to an open enum first, which is a better fit for "
          "extremely large enums.\n");
    }
    absl::Status status = ValidateNestInFileClassFeature(enm);
    if (!status.ok()) {
      absl::StrAppend(error, status.message());
    }
  });

  google::protobuf::internal::VisitDescriptors(*file_, [&](const Descriptor& message) {
    absl::Status status = ValidateNestInFileClassFeature(message);
    if (!status.ok()) {
      absl::StrAppend(error, status.message());
    }
  });

  if (JavaGenerator::GetEdition(*file_) >= Edition::EDITION_2024) {
    if (file_->options().has_java_multiple_files()) {
      absl::StrAppend(
          error,
          "The file option `java_multiple_files` is not supported in "
          "editions 2024 and above, which defaults to the feature value of"
          " `nest_in_file_class = NO` (equivalent to "
          "`java_multiple_files = true`).");
    }
  }

  return error->empty();
}